

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O0

arg_t * SEM_VarList(ast *node,field_t **f)

{
  arg_t *f_00;
  attr *paVar1;
  ast *paVar2;
  arg_t *paVar3;
  ast *in_RSI;
  ast *in_RDI;
  ast *child3;
  arg_t *a;
  
  f_00 = (arg_t *)malloc(0x10);
  child(in_RDI,1);
  paVar1 = SEM_ParamDec(in_RSI,(field_t **)f_00);
  f_00->arg = paVar1;
  paVar2 = child(in_RDI,3);
  if (paVar2 == (ast *)0x0) {
    f_00->next = (arg_t *)0x0;
  }
  else {
    paVar3 = SEM_VarList(in_RSI,(field_t **)f_00);
    f_00->next = paVar3;
  }
  return f_00;
}

Assistant:

static struct arg_t* SEM_VarList(struct ast *node, struct field_t **f) {
    struct arg_t *a = malloc(sizeof(struct arg_t));
    a->arg = SEM_ParamDec(child(node, 1), f);
    struct ast *child3 = child(node, 3);
    if (child3)
        a->next = SEM_VarList(child3, f);
    else
        a->next = NULL;
    return a;
}